

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O1

ValueT * Qentem::JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::parseValue
                   (ValueT *__return_storage_ptr__,StringStream<char16_t> *stream,char16_t *content,
                   SizeT *offset,SizeT length)

{
  char16_t cVar1;
  QNumberType QVar2;
  ValueType VVar3;
  uint uVar4;
  SizeT SVar5;
  uint uVar6;
  undefined4 extraout_var;
  char16_t *pcVar7;
  char16_t *pcVar8;
  SizeT SVar9;
  QNumber64 number;
  char16_t *local_50;
  QNumber64 local_48;
  undefined4 local_40;
  undefined8 local_38;
  
  uVar4 = *offset;
  cVar1 = content[uVar4];
  if ((ushort)cVar1 < 0x6e) {
    if (cVar1 == L'\"') {
      uVar4 = uVar4 + 1;
      *offset = uVar4;
      local_50 = content + uVar4;
      SVar5 = JSONUtils::UnEscape<char16_t,Qentem::StringStream<char16_t>>
                        (local_50,length - uVar4,stream);
      local_38 = CONCAT44(extraout_var,SVar5);
      if (SVar5 != 0) {
        *offset = *offset + SVar5;
        SVar9 = stream->length_;
        if (SVar9 == 0) {
          SVar9 = SVar5 - 1;
        }
        else {
          local_50 = stream->storage_;
          stream->length_ = 0;
        }
        local_48.Natural = 0;
        local_40 = 0;
        pcVar7 = String<char16_t>::allocate((String<char16_t> *)&local_48,SVar9 + 1);
        Memory::Copy<unsigned_int>(pcVar7,local_50,SVar9 * 2);
        pcVar7[SVar9] = L'\0';
        (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_48;
        (__return_storage_ptr__->field_0).array_.index_ = SVar9;
        local_40 = 0;
        local_48.Natural = 0;
        __return_storage_ptr__->type_ = String;
        operator_delete((void *)0x0);
        if ((int)local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      goto LAB_00122be7;
    }
    if (cVar1 == L'[') {
      *offset = uVar4 + 1;
      parseArray(__return_storage_ptr__,stream,content,offset,length);
      return __return_storage_ptr__;
    }
    if (cVar1 == L'f') {
      uVar4 = uVar4 + 1;
      if (uVar4 < length) {
        pcVar8 = content + uVar4;
        pcVar7 = L"alse";
        do {
          uVar6 = uVar4;
          if (*pcVar8 != *pcVar7) break;
          pcVar7 = pcVar7 + 1;
          uVar4 = uVar4 + 1;
          pcVar8 = pcVar8 + 1;
          uVar6 = length;
        } while (length != uVar4);
      }
      else {
        pcVar7 = L"alse";
        uVar6 = uVar4;
      }
      *offset = uVar6;
      if (*pcVar7 == L'\0') {
        (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
        __return_storage_ptr__->type_ = False;
        return __return_storage_ptr__;
      }
      goto LAB_00122be7;
    }
  }
  else {
    if (cVar1 == L'{') {
      *offset = uVar4 + 1;
      parseObject(__return_storage_ptr__,stream,content,offset,length);
      return __return_storage_ptr__;
    }
    if (cVar1 == L't') {
      uVar4 = uVar4 + 1;
      if (uVar4 < length) {
        pcVar8 = content + uVar4;
        pcVar7 = L"rue";
        do {
          uVar6 = uVar4;
          if (*pcVar8 != *pcVar7) break;
          pcVar7 = pcVar7 + 1;
          uVar4 = uVar4 + 1;
          pcVar8 = pcVar8 + 1;
          uVar6 = length;
        } while (length != uVar4);
      }
      else {
        pcVar7 = L"rue";
        uVar6 = uVar4;
      }
      *offset = uVar6;
      if (*pcVar7 == L'\0') {
        (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
        __return_storage_ptr__->type_ = True;
        return __return_storage_ptr__;
      }
      goto LAB_00122be7;
    }
    if (cVar1 == L'n') {
      uVar4 = uVar4 + 1;
      if (uVar4 < length) {
        pcVar8 = content + uVar4;
        pcVar7 = L"ull";
        do {
          uVar6 = uVar4;
          if (*pcVar8 != *pcVar7) break;
          pcVar7 = pcVar7 + 1;
          uVar4 = uVar4 + 1;
          pcVar8 = pcVar8 + 1;
          uVar6 = length;
        } while (length != uVar4);
      }
      else {
        pcVar7 = L"ull";
        uVar6 = uVar4;
      }
      *offset = uVar6;
      if (*pcVar7 == L'\0') {
        (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
        __return_storage_ptr__->type_ = Null;
        return __return_storage_ptr__;
      }
      goto LAB_00122be7;
    }
  }
  local_48.Natural = 0;
  QVar2 = Digit::stringToNumber<char16_t>(&local_48,content,offset,length);
  if (QVar2 == Real) {
    (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_48;
    VVar3 = Double;
  }
  else if (QVar2 == Integer) {
    (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_48;
    VVar3 = IntLong;
  }
  else {
    if (QVar2 != Natural) {
LAB_00122be7:
      *offset = length;
      (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
      *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
      *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
      __return_storage_ptr__->type_ = Undefined;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_48;
    VVar3 = UIntLong;
  }
  __return_storage_ptr__->type_ = VVar3;
  return __return_storage_ptr__;
}

Assistant:

static ValueT parseValue(Stream_T &stream, const Char_T *content, SizeT &offset, const SizeT length) {
            switch (content[offset]) {
                case JSONotation::SCurlyChar: {
                    ++offset;
                    return parseObject(stream, content, offset, length);
                }

                case JSONotation::SSquareChar: {
                    ++offset;
                    return parseArray(stream, content, offset, length);
                }

                case JSONotation::QuoteChar: {
                    ++offset;

                    const Char_T *str = (content + offset);
                    SizeT         len = JSONUtils::UnEscape(str, (length - offset), stream);

                    if (len != 0) {
                        offset += len;
                        --len;

                        if (stream.IsNotEmpty()) {
                            str = stream.First();
                            len = stream.Length();
                            stream.Clear();
                        }

                        return ValueT{String<Char_T>{str, len}};
                    }

                    break;
                }

                case JSONotation::T_Char: {
                    const Char_T *true_string = (JSONotation::TrueString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *true_string)) {
                        ++true_string;
                        ++offset;
                    }

                    if (*true_string == Char_T{0}) {
                        return ValueT{ValueType::True};
                    }

                    break;
                }

                case JSONotation::F_Char: {
                    const Char_T *false_string = (JSONotation::FalseString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *false_string)) {
                        ++false_string;
                        ++offset;
                    }

                    if (*false_string == Char_T{0}) {
                        return ValueT{ValueType::False};
                    }

                    break;
                }

                case JSONotation::N_Char: {
                    const Char_T *null_string = (JSONotation::NullString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *null_string)) {
                        ++null_string;
                        ++offset;
                    }

                    if (*null_string == Char_T{0}) {
                        return ValueT{ValueType::Null};
                    }

                    break;
                }

                default: {
                    QNumber64 number;

                    switch (Digit::StringToNumber(number, content, offset, length)) {
                        case QNumberType::Natural: {
                            return ValueT{number.Natural};
                        }

                        case QNumberType::Integer: {
                            return ValueT{number.Integer};
                        }

                        case QNumberType::Real: {
                            return ValueT{number.Real};
                        }

                        default: {
                        }
                    };
                }
            }

            offset = length;
            return ValueT{};
        }